

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstylesheetstyle.cpp
# Opt level: O0

bool __thiscall QRenderRule::hasModification(QRenderRule *this)

{
  bool bVar1;
  long in_RDI;
  QRenderRule *unaff_retaddr;
  undefined7 in_stack_fffffffffffffff0;
  undefined1 in_stack_fffffffffffffff7;
  byte bVar2;
  
  bVar1 = hasPalette((QRenderRule *)CONCAT17(in_stack_fffffffffffffff7,in_stack_fffffffffffffff0));
  bVar2 = 1;
  if (!bVar1) {
    bVar1 = hasBackground(unaff_retaddr);
    bVar2 = 1;
    if (!bVar1) {
      bVar1 = hasGradientBackground((QRenderRule *)CONCAT17(1,in_stack_fffffffffffffff0));
      bVar2 = 1;
      if (!bVar1) {
        bVar1 = hasNativeBorder(unaff_retaddr);
        bVar2 = 1;
        if (bVar1) {
          bVar1 = hasNativeOutline(unaff_retaddr);
          bVar2 = 1;
          if (bVar1) {
            bVar1 = hasBox((QRenderRule *)CONCAT17(1,in_stack_fffffffffffffff0));
            bVar2 = 1;
            if (!bVar1) {
              bVar1 = hasPosition((QRenderRule *)CONCAT17(1,in_stack_fffffffffffffff0));
              bVar2 = 1;
              if (!bVar1) {
                bVar1 = hasGeometry((QRenderRule *)CONCAT17(1,in_stack_fffffffffffffff0));
                bVar2 = 1;
                if (!bVar1) {
                  bVar1 = hasImage((QRenderRule *)CONCAT17(1,in_stack_fffffffffffffff0));
                  bVar2 = 1;
                  if ((!bVar1) && (bVar2 = 1, (*(byte *)(in_RDI + 0x20) & 1) == 0)) {
                    bVar1 = QHash<QString,_QVariant>::isEmpty
                                      ((QHash<QString,_QVariant> *)(in_RDI + 0x28));
                    bVar2 = bVar1 ^ 0xff;
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return (bool)(bVar2 & 1);
}

Assistant:

bool QRenderRule::hasModification() const
{
    return hasPalette() ||
           hasBackground() ||
           hasGradientBackground() ||
           !hasNativeBorder() ||
           !hasNativeOutline() ||
           hasBox() ||
           hasPosition() ||
           hasGeometry() ||
           hasImage() ||
           hasFont ||
           !styleHints.isEmpty();
}